

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdsample.c
# Opt level: O3

void h1v2_fancy_upsample(j_decompress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                        JSAMPARRAY *output_data_ptr)

{
  byte bVar1;
  JSAMPARRAY ppJVar2;
  JSAMPROW pJVar3;
  long lVar4;
  JSAMPROW pJVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  bool bVar12;
  
  if (0 < cinfo->max_v_samp_factor) {
    ppJVar2 = *output_data_ptr;
    uVar10 = compptr->downsampled_width;
    lVar6 = 0;
    lVar8 = 0;
    do {
      lVar8 = (long)(int)lVar8;
      iVar9 = 1;
      uVar7 = uVar10;
      do {
        if (uVar7 == 0) {
          uVar7 = 0;
        }
        else {
          pJVar3 = ppJVar2[lVar8];
          lVar4 = *(long *)(((ulong)(((byte)~(byte)iVar9 & 1) << 4) - 8) +
                           (long)(input_data + lVar6));
          pJVar5 = input_data[lVar6];
          lVar11 = 0;
          do {
            bVar1 = pJVar5[lVar11];
            pJVar3[lVar11] =
                 (JSAMPLE)((uint)*(byte *)(lVar4 + lVar11) + (2U - iVar9 & 0xffff) +
                           (uint)bVar1 + (uint)bVar1 * 2 >> 2);
            uVar10 = compptr->downsampled_width;
            lVar11 = lVar11 + 1;
            uVar7 = uVar10;
          } while ((uint)lVar11 < uVar10);
        }
        lVar8 = lVar8 + 1;
        bVar12 = iVar9 != 0;
        iVar9 = 0;
      } while (bVar12);
      lVar6 = lVar6 + 1;
    } while ((int)lVar8 < cinfo->max_v_samp_factor);
  }
  return;
}

Assistant:

METHODDEF(void)
h1v2_fancy_upsample(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                    JSAMPARRAY input_data, JSAMPARRAY *output_data_ptr)
{
  JSAMPARRAY output_data = *output_data_ptr;
  JSAMPROW inptr0, inptr1, outptr;
#if BITS_IN_JSAMPLE == 8
  int thiscolsum, bias;
#else
  JLONG thiscolsum, bias;
#endif
  JDIMENSION colctr;
  int inrow, outrow, v;

  inrow = outrow = 0;
  while (outrow < cinfo->max_v_samp_factor) {
    for (v = 0; v < 2; v++) {
      /* inptr0 points to nearest input row, inptr1 points to next nearest */
      inptr0 = input_data[inrow];
      if (v == 0) {             /* next nearest is row above */
        inptr1 = input_data[inrow - 1];
        bias = 1;
      } else {                  /* next nearest is row below */
        inptr1 = input_data[inrow + 1];
        bias = 2;
      }
      outptr = output_data[outrow++];

      for (colctr = 0; colctr < compptr->downsampled_width; colctr++) {
        thiscolsum = (*inptr0++) * 3 + (*inptr1++);
        *outptr++ = (JSAMPLE)((thiscolsum + bias) >> 2);
      }
    }
    inrow++;
  }
}